

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adventurer.cpp
# Opt level: O0

void __thiscall despot::Adventurer::Adventurer(Adventurer *this,int num_goals)

{
  ostream *this_00;
  istringstream local_388 [8];
  istringstream iss;
  allocator<char> local_201;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  byte local_1dc;
  byte local_1db;
  byte local_1da;
  allocator<char> local_1d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  byte local_1b4;
  byte local_1b3;
  byte local_1b2;
  allocator<char> local_1b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  byte local_18b;
  byte local_18a;
  allocator<char> local_189;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  byte local_123;
  byte local_122;
  allocator<char> local_121;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  byte local_fc;
  byte local_fb;
  byte local_fa;
  allocator<char> local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  byte local_d4;
  byte local_d3;
  byte local_d2;
  allocator<char> local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  byte local_ab;
  byte local_aa;
  allocator<char> local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string map;
  int num_goals_local;
  Adventurer *this_local;
  
  despot::BeliefMDP::BeliefMDP(&this->super_BeliefMDP);
  MDP::MDP(&this->super_MDP);
  StateIndexer::StateIndexer(&this->super_StateIndexer);
  StatePolicy::StatePolicy(&this->super_StatePolicy);
  *(undefined ***)this = &PTR__Adventurer_001399b0;
  *(undefined ***)&this->super_MDP = &PTR__Adventurer_00139ae8;
  *(undefined ***)&this->super_StateIndexer = &PTR__Adventurer_00139b38;
  *(undefined ***)&this->super_StatePolicy = &PTR__Adventurer_00139b70;
  std::vector<double,_std::allocator<double>_>::vector(&this->goal_prob_);
  std::vector<double,_std::allocator<double>_>::vector(&this->goal_reward_);
  std::vector<double,_std::allocator<double>_>::vector(&this->trap_prob_);
  std::vector<despot::AdventurerState_*,_std::allocator<despot::AdventurerState_*>_>::vector
            (&this->states_);
  std::
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ::vector(&this->transition_probabilities_);
  MemoryPool<despot::AdventurerState>::MemoryPool(&this->memory_pool_);
  std::vector<int,_std::allocator<int>_>::vector(&this->default_action_);
  current_ = this;
  if ((num_goals != 2) && (num_goals != 0x32)) {
    this_00 = std::operator<<((ostream *)&std::cerr,
                              "[Adventurer::Adventurer] Only 2 or 50 goals are supported.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  local_aa = 0;
  local_ab = 0;
  local_d2 = 0;
  local_d3 = 0;
  local_d4 = 0;
  local_fa = 0;
  local_fb = 0;
  local_fc = 0;
  local_122 = 0;
  local_123 = 0;
  local_18a = 0;
  local_18b = 0;
  local_1b2 = 0;
  local_1b3 = 0;
  local_1b4 = 0;
  local_1da = 0;
  local_1db = 0;
  local_1dc = 0;
  if (num_goals == 2) {
    std::allocator<char>::allocator();
    local_aa = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"mapSize = 5 nGoal = 2\n",&local_a9);
    local_ab = 1;
    std::allocator<char>::allocator();
    local_d2 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"0.5 0.5 0.5 0.5 0.5\n",&local_d1);
    local_d3 = 1;
    std::operator+(&local_88,&local_a8,&local_d0);
    local_d4 = 1;
    std::allocator<char>::allocator();
    local_fa = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"0.5 101 0.5 150\n",&local_f9);
    local_fb = 1;
    std::operator+(&local_68,&local_88,&local_f8);
    local_fc = 1;
    std::allocator<char>::allocator();
    local_122 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"0.3",&local_121);
    local_123 = 1;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                   &local_68,&local_120);
  }
  else {
    std::allocator<char>::allocator();
    local_18a = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_188,"mapSize = 5 nGoal = 50\n",&local_189);
    local_18b = 1;
    std::allocator<char>::allocator();
    local_1b2 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,"0.5 0.5 0.5 0.5 0.5\n",&local_1b1);
    local_1b3 = 1;
    std::operator+(&local_168,&local_188,&local_1b0);
    local_1b4 = 1;
    std::allocator<char>::allocator();
    local_1da = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,
               "0.02 101 0.02 102 0.02 103 0.02 104 0.02 105 0.02 106 0.02 107 0.02 108 0.02 109 0.02 110 0.02 111 0.02 112 0.02 113 0.02 114 0.02 115 0.02 116 0.02 117 0.02 118 0.02 119 0.02 120 0.02 121 0.02 122 0.02 123 0.02 124 0.02 125 0.02 126 0.02 127 0.02 128 0.02 129 0.02 130 0.02 131 0.02 132 0.02 133 0.02 134 0.02 135 0.02 136 0.02 137 0.02 138 0.02 139 0.02 140 0.02 141 0.02 142 0.02 143 0.02 144 0.02 145 0.02 146 0.02 147 0.02 148 0.02 149 0.02 150\n"
               ,&local_1d9);
    local_1db = 1;
    std::operator+(&local_148,&local_168,&local_1d8);
    local_1dc = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"0.3",&local_201);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                   &local_148,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
  }
  if ((local_1dc & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_148);
  }
  if ((local_1db & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  if ((local_1da & 1) != 0) {
    std::allocator<char>::~allocator(&local_1d9);
  }
  if ((local_1b4 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_168);
  }
  if ((local_1b3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_1b0);
  }
  if ((local_1b2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_1b1);
  }
  if ((local_18b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_188);
  }
  if ((local_18a & 1) != 0) {
    std::allocator<char>::~allocator(&local_189);
  }
  if ((local_123 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_120);
  }
  if ((local_122 & 1) != 0) {
    std::allocator<char>::~allocator(&local_121);
  }
  if ((local_fc & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_68);
  }
  if ((local_fb & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_f8);
  }
  if ((local_fa & 1) != 0) {
    std::allocator<char>::~allocator(&local_f9);
  }
  if ((local_d4 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_88);
  }
  if ((local_d3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_d0);
  }
  if ((local_d2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_d1);
  }
  if ((local_ab & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_a8);
  }
  if ((local_aa & 1) != 0) {
    std::allocator<char>::~allocator(&local_a9);
  }
  std::__cxx11::istringstream::istringstream(local_388,(string *)local_48,_S_in);
  Init(this,(istream *)local_388);
  std::__cxx11::istringstream::~istringstream(local_388);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

Adventurer::Adventurer(int num_goals) {
	current_ = this;

	if (num_goals != 2 && num_goals != 50) {
		cerr << "[Adventurer::Adventurer] Only 2 or 50 goals are supported." << endl;
		exit(0);
	}

	string map =
		num_goals == 2 ?
		(string("mapSize = 5 nGoal = 2\n")
			+ string("0.5 0.5 0.5 0.5 0.5\n") // probabilities of being trapped
			+ string("0.5 101 0.5 150\n") // goal probability, goal reward
			+ string("0.3") // observation noise
		)
		:
		(string("mapSize = 5 nGoal = 50\n")
			+ string("0.5 0.5 0.5 0.5 0.5\n") // probabilities of being trapped
			+ string("0.02 101 0.02 102 0.02 103 0.02 104 0.02 105 0.02 106 0.02 107 0.02 108 0.02 109 0.02 110 0.02 111 0.02 112 0.02 113 0.02 114 0.02 115 0.02 116 0.02 117 0.02 118 0.02 119 0.02 120 0.02 121 0.02 122 0.02 123 0.02 124 0.02 125 0.02 126 0.02 127 0.02 128 0.02 129 0.02 130 0.02 131 0.02 132 0.02 133 0.02 134 0.02 135 0.02 136 0.02 137 0.02 138 0.02 139 0.02 140 0.02 141 0.02 142 0.02 143 0.02 144 0.02 145 0.02 146 0.02 147 0.02 148 0.02 149 0.02 150\n")  // goal probability, goal reward
			+ string("0.3") // observation noise
		);

	istringstream iss(map);
	Init(iss);
	// PrintPOMDPX();
}